

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O0

IntrinsicType __thiscall soul::getIntrinsicTypeFromName(soul *this,string_view s)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_4a0;
  soul *local_490;
  char *local_488;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_480;
  soul *local_470;
  char *local_468;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_460;
  soul *local_450;
  char *local_448;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_440;
  soul *local_430;
  char *local_428;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_420;
  soul *local_410;
  char *local_408;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_400;
  soul *local_3f0;
  char *local_3e8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3e0;
  soul *local_3d0;
  char *local_3c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3c0;
  soul *local_3b0;
  char *local_3a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_3a0;
  soul *local_390;
  char *local_388;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_380;
  soul *local_370;
  char *local_368;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_360;
  soul *local_350;
  char *local_348;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_340;
  soul *local_330;
  char *local_328;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_320;
  soul *local_310;
  char *local_308;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_300;
  soul *local_2f0;
  char *local_2e8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2e0;
  soul *local_2d0;
  char *local_2c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2c0;
  soul *local_2b0;
  char *local_2a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_2a0;
  soul *local_290;
  char *local_288;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_280;
  soul *local_270;
  char *local_268;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_260;
  soul *local_250;
  char *local_248;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_240;
  soul *local_230;
  char *local_228;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_220;
  soul *local_210;
  char *local_208;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_200;
  soul *local_1f0;
  char *local_1e8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1e0;
  soul *local_1d0;
  char *local_1c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c0;
  soul *local_1b0;
  char *local_1a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1a0;
  soul *local_190;
  char *local_188;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_180;
  soul *local_170;
  char *local_168;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_160;
  soul *local_150;
  char *local_148;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_140;
  soul *local_130;
  char *local_128;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_120;
  soul *local_110;
  char *local_108;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_100;
  soul *local_f0;
  char *local_e8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e0;
  soul *local_d0;
  char *local_c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c0;
  soul *local_b0;
  char *local_a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a0;
  soul *local_90;
  char *local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  soul *local_70;
  char *local_68;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_60;
  soul *local_50;
  char *local_48;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_40;
  soul *local_30;
  char *local_28;
  soul *local_20;
  string_view s_local;
  
  local_28 = (char *)s._M_len;
  local_30 = this;
  local_20 = this;
  s_local._M_len = (size_t)local_28;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"abs");
  __x_34._M_str = local_28;
  __x_34._M_len = (size_t)local_30;
  bVar1 = std::operator==(__x_34,local_40);
  if (bVar1) {
    s_local._M_str._4_4_ = abs;
  }
  else {
    local_50 = local_20;
    local_48 = (char *)s_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"min");
    __x_33._M_str = local_48;
    __x_33._M_len = (size_t)local_50;
    bVar1 = std::operator==(__x_33,local_60);
    if (bVar1) {
      s_local._M_str._4_4_ = min;
    }
    else {
      local_70 = local_20;
      local_68 = (char *)s_local._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"max");
      __x_32._M_str = local_68;
      __x_32._M_len = (size_t)local_70;
      bVar1 = std::operator==(__x_32,local_80);
      if (bVar1) {
        s_local._M_str._4_4_ = max;
      }
      else {
        local_90 = local_20;
        local_88 = (char *)s_local._M_len;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"clamp");
        __x_31._M_str = local_88;
        __x_31._M_len = (size_t)local_90;
        bVar1 = std::operator==(__x_31,local_a0);
        if (bVar1) {
          s_local._M_str._4_4_ = clamp;
        }
        else {
          local_b0 = local_20;
          local_a8 = (char *)s_local._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"wrap")
          ;
          __x_30._M_str = local_a8;
          __x_30._M_len = (size_t)local_b0;
          bVar1 = std::operator==(__x_30,local_c0);
          if (bVar1) {
            s_local._M_str._4_4_ = wrap;
          }
          else {
            local_d0 = local_20;
            local_c8 = (char *)s_local._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_e0,"fmod");
            __x_29._M_str = local_c8;
            __x_29._M_len = (size_t)local_d0;
            bVar1 = std::operator==(__x_29,local_e0);
            if (bVar1) {
              s_local._M_str._4_4_ = fmod;
            }
            else {
              local_f0 = local_20;
              local_e8 = (char *)s_local._M_len;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_100,"remainder");
              __x_28._M_str = local_e8;
              __x_28._M_len = (size_t)local_f0;
              bVar1 = std::operator==(__x_28,local_100);
              if (bVar1) {
                s_local._M_str._4_4_ = remainder;
              }
              else {
                local_110 = local_20;
                local_108 = (char *)s_local._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_120,"floor");
                __x_27._M_str = local_108;
                __x_27._M_len = (size_t)local_110;
                bVar1 = std::operator==(__x_27,local_120);
                if (bVar1) {
                  s_local._M_str._4_4_ = floor;
                }
                else {
                  local_130 = local_20;
                  local_128 = (char *)s_local._M_len;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (&local_140,"ceil");
                  __x_26._M_str = local_128;
                  __x_26._M_len = (size_t)local_130;
                  bVar1 = std::operator==(__x_26,local_140);
                  if (bVar1) {
                    s_local._M_str._4_4_ = ceil;
                  }
                  else {
                    local_150 = local_20;
                    local_148 = (char *)s_local._M_len;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (&local_160,"addModulo2Pi");
                    __x_25._M_str = local_148;
                    __x_25._M_len = (size_t)local_150;
                    bVar1 = std::operator==(__x_25,local_160);
                    if (bVar1) {
                      s_local._M_str._4_4_ = addModulo2Pi;
                    }
                    else {
                      local_170 = local_20;
                      local_168 = (char *)s_local._M_len;
                      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                (&local_180,"sqrt");
                      __x_24._M_str = local_168;
                      __x_24._M_len = (size_t)local_170;
                      bVar1 = std::operator==(__x_24,local_180);
                      if (bVar1) {
                        s_local._M_str._4_4_ = sqrt;
                      }
                      else {
                        local_190 = local_20;
                        local_188 = (char *)s_local._M_len;
                        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                  (&local_1a0,"pow");
                        __x_23._M_str = local_188;
                        __x_23._M_len = (size_t)local_190;
                        bVar1 = std::operator==(__x_23,local_1a0);
                        if (bVar1) {
                          s_local._M_str._4_4_ = pow;
                        }
                        else {
                          local_1b0 = local_20;
                          local_1a8 = (char *)s_local._M_len;
                          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                    (&local_1c0,"exp");
                          __x_22._M_str = local_1a8;
                          __x_22._M_len = (size_t)local_1b0;
                          bVar1 = std::operator==(__x_22,local_1c0);
                          if (bVar1) {
                            s_local._M_str._4_4_ = exp;
                          }
                          else {
                            local_1d0 = local_20;
                            local_1c8 = (char *)s_local._M_len;
                            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                                      (&local_1e0,"log");
                            __x_21._M_str = local_1c8;
                            __x_21._M_len = (size_t)local_1d0;
                            bVar1 = std::operator==(__x_21,local_1e0);
                            if (bVar1) {
                              s_local._M_str._4_4_ = log;
                            }
                            else {
                              local_1f0 = local_20;
                              local_1e8 = (char *)s_local._M_len;
                              std::basic_string_view<char,_std::char_traits<char>_>::
                              basic_string_view(&local_200,"log10");
                              __x_20._M_str = local_1e8;
                              __x_20._M_len = (size_t)local_1f0;
                              bVar1 = std::operator==(__x_20,local_200);
                              if (bVar1) {
                                s_local._M_str._4_4_ = log10;
                              }
                              else {
                                local_210 = local_20;
                                local_208 = (char *)s_local._M_len;
                                std::basic_string_view<char,_std::char_traits<char>_>::
                                basic_string_view(&local_220,"sin");
                                __x_19._M_str = local_208;
                                __x_19._M_len = (size_t)local_210;
                                bVar1 = std::operator==(__x_19,local_220);
                                if (bVar1) {
                                  s_local._M_str._4_4_ = sin;
                                }
                                else {
                                  local_230 = local_20;
                                  local_228 = (char *)s_local._M_len;
                                  std::basic_string_view<char,_std::char_traits<char>_>::
                                  basic_string_view(&local_240,"cos");
                                  __x_18._M_str = local_228;
                                  __x_18._M_len = (size_t)local_230;
                                  bVar1 = std::operator==(__x_18,local_240);
                                  if (bVar1) {
                                    s_local._M_str._4_4_ = cos;
                                  }
                                  else {
                                    local_250 = local_20;
                                    local_248 = (char *)s_local._M_len;
                                    std::basic_string_view<char,_std::char_traits<char>_>::
                                    basic_string_view(&local_260,"tan");
                                    __x_17._M_str = local_248;
                                    __x_17._M_len = (size_t)local_250;
                                    bVar1 = std::operator==(__x_17,local_260);
                                    if (bVar1) {
                                      s_local._M_str._4_4_ = tan;
                                    }
                                    else {
                                      local_270 = local_20;
                                      local_268 = (char *)s_local._M_len;
                                      std::basic_string_view<char,_std::char_traits<char>_>::
                                      basic_string_view(&local_280,"sinh");
                                      __x_16._M_str = local_268;
                                      __x_16._M_len = (size_t)local_270;
                                      bVar1 = std::operator==(__x_16,local_280);
                                      if (bVar1) {
                                        s_local._M_str._4_4_ = sinh;
                                      }
                                      else {
                                        local_290 = local_20;
                                        local_288 = (char *)s_local._M_len;
                                        std::basic_string_view<char,_std::char_traits<char>_>::
                                        basic_string_view(&local_2a0,"cosh");
                                        __x_15._M_str = local_288;
                                        __x_15._M_len = (size_t)local_290;
                                        bVar1 = std::operator==(__x_15,local_2a0);
                                        if (bVar1) {
                                          s_local._M_str._4_4_ = cosh;
                                        }
                                        else {
                                          local_2b0 = local_20;
                                          local_2a8 = (char *)s_local._M_len;
                                          std::basic_string_view<char,_std::char_traits<char>_>::
                                          basic_string_view(&local_2c0,"tanh");
                                          __x_14._M_str = local_2a8;
                                          __x_14._M_len = (size_t)local_2b0;
                                          bVar1 = std::operator==(__x_14,local_2c0);
                                          if (bVar1) {
                                            s_local._M_str._4_4_ = tanh;
                                          }
                                          else {
                                            local_2d0 = local_20;
                                            local_2c8 = (char *)s_local._M_len;
                                            std::basic_string_view<char,_std::char_traits<char>_>::
                                            basic_string_view(&local_2e0,"asinh");
                                            __x_13._M_str = local_2c8;
                                            __x_13._M_len = (size_t)local_2d0;
                                            bVar1 = std::operator==(__x_13,local_2e0);
                                            if (bVar1) {
                                              s_local._M_str._4_4_ = asinh;
                                            }
                                            else {
                                              local_2f0 = local_20;
                                              local_2e8 = (char *)s_local._M_len;
                                              std::basic_string_view<char,_std::char_traits<char>_>
                                              ::basic_string_view(&local_300,"acosh");
                                              __x_12._M_str = local_2e8;
                                              __x_12._M_len = (size_t)local_2f0;
                                              bVar1 = std::operator==(__x_12,local_300);
                                              if (bVar1) {
                                                s_local._M_str._4_4_ = acosh;
                                              }
                                              else {
                                                local_310 = local_20;
                                                local_308 = (char *)s_local._M_len;
                                                std::
                                                basic_string_view<char,_std::char_traits<char>_>::
                                                basic_string_view(&local_320,"atanh");
                                                __x_11._M_str = local_308;
                                                __x_11._M_len = (size_t)local_310;
                                                bVar1 = std::operator==(__x_11,local_320);
                                                if (bVar1) {
                                                  s_local._M_str._4_4_ = atanh;
                                                }
                                                else {
                                                  local_330 = local_20;
                                                  local_328 = (char *)s_local._M_len;
                                                  std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_340,"asin");
                                                  __x_10._M_str = local_328;
                                                  __x_10._M_len = (size_t)local_330;
                                                  bVar1 = std::operator==(__x_10,local_340);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = asin;
                                                  }
                                                  else {
                                                    local_350 = local_20;
                                                    local_348 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_360,"acos");
                                                  __x_09._M_str = local_348;
                                                  __x_09._M_len = (size_t)local_350;
                                                  bVar1 = std::operator==(__x_09,local_360);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = acos;
                                                  }
                                                  else {
                                                    local_370 = local_20;
                                                    local_368 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_380,"atan");
                                                  __x_08._M_str = local_368;
                                                  __x_08._M_len = (size_t)local_370;
                                                  bVar1 = std::operator==(__x_08,local_380);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = atan;
                                                  }
                                                  else {
                                                    local_390 = local_20;
                                                    local_388 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_3a0,"atan2");
                                                  __x_07._M_str = local_388;
                                                  __x_07._M_len = (size_t)local_390;
                                                  bVar1 = std::operator==(__x_07,local_3a0);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = atan2;
                                                  }
                                                  else {
                                                    local_3b0 = local_20;
                                                    local_3a8 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_3c0,"isnan");
                                                  __x_06._M_str = local_3a8;
                                                  __x_06._M_len = (size_t)local_3b0;
                                                  bVar1 = std::operator==(__x_06,local_3c0);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = isnan;
                                                  }
                                                  else {
                                                    local_3d0 = local_20;
                                                    local_3c8 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_3e0,"isinf");
                                                  __x_05._M_str = local_3c8;
                                                  __x_05._M_len = (size_t)local_3d0;
                                                  bVar1 = std::operator==(__x_05,local_3e0);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = isinf;
                                                  }
                                                  else {
                                                    local_3f0 = local_20;
                                                    local_3e8 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_400,"roundToInt");
                                                  __x_04._M_str = local_3e8;
                                                  __x_04._M_len = (size_t)local_3f0;
                                                  bVar1 = std::operator==(__x_04,local_400);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = roundToInt;
                                                  }
                                                  else {
                                                    local_410 = local_20;
                                                    local_408 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_420,"sum");
                                                  __x_03._M_str = local_408;
                                                  __x_03._M_len = (size_t)local_410;
                                                  bVar1 = std::operator==(__x_03,local_420);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = sum;
                                                  }
                                                  else {
                                                    local_430 = local_20;
                                                    local_428 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_440,"product");
                                                  __x_02._M_str = local_428;
                                                  __x_02._M_len = (size_t)local_430;
                                                  bVar1 = std::operator==(__x_02,local_440);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = product;
                                                  }
                                                  else {
                                                    local_450 = local_20;
                                                    local_448 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_460,"get_array_size");
                                                  __x_01._M_str = local_448;
                                                  __x_01._M_len = (size_t)local_450;
                                                  bVar1 = std::operator==(__x_01,local_460);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = get_array_size;
                                                  }
                                                  else {
                                                    local_470 = local_20;
                                                    local_468 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_480,"read");
                                                  __x_00._M_str = local_468;
                                                  __x_00._M_len = (size_t)local_470;
                                                  bVar1 = std::operator==(__x_00,local_480);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = read;
                                                  }
                                                  else {
                                                    local_490 = local_20;
                                                    local_488 = (char *)s_local._M_len;
                                                    std::
                                                  basic_string_view<char,_std::char_traits<char>_>::
                                                  basic_string_view(&local_4a0,
                                                                    "readLinearInterpolated");
                                                  __x._M_str = local_488;
                                                  __x._M_len = (size_t)local_490;
                                                  bVar1 = std::operator==(__x,local_4a0);
                                                  if (bVar1) {
                                                    s_local._M_str._4_4_ = readLinearInterpolated;
                                                  }
                                                  else {
                                                    s_local._M_str._4_4_ = none;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return s_local._M_str._4_4_;
}

Assistant:

IntrinsicType getIntrinsicTypeFromName (std::string_view s)
{
    #define SOUL_MATCH_INTRINSIC(i)  if (s == #i) return IntrinsicType::i;
    SOUL_INTRINSICS (SOUL_MATCH_INTRINSIC)
    #undef SOUL_MATCH_INTRINSIC

    return IntrinsicType::none;
}